

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void glob_path_dialog(t_pd *dummy,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_namelist *ptVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  t_float tVar6;
  
  namelist_free((pd_maininstance.pd_stuff)->st_searchpath);
  (pd_maininstance.pd_stuff)->st_searchpath = (t_namelist *)0x0;
  iVar4 = 0;
  tVar6 = atom_getfloatarg(0,argc,argv);
  sys_usestdpath = (int)tVar6;
  tVar6 = atom_getfloatarg(1,argc,argv);
  sys_verbose = (int)tVar6;
  iVar3 = 2;
  if (2 < argc) {
    iVar3 = argc;
  }
  iVar3 = iVar3 + -2;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    ptVar1 = atom_getsymbolarg(iVar4 + 2,argc,argv);
    ptVar1 = sys_decodedialog(ptVar1);
    if (*ptVar1->s_name != '\0') {
      ptVar2 = namelist_append_files((pd_maininstance.pd_stuff)->st_searchpath,ptVar1->s_name);
      (pd_maininstance.pd_stuff)->st_searchpath = ptVar2;
    }
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void glob_path_dialog(t_pd *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    namelist_free(STUFF->st_searchpath);
    STUFF->st_searchpath = 0;
    sys_usestdpath = atom_getfloatarg(0, argc, argv);
    sys_verbose = atom_getfloatarg(1, argc, argv);
    for (i = 0; i < argc-2; i++)
    {
        t_symbol *s = sys_decodedialog(atom_getsymbolarg(i+2, argc, argv));
        if (*s->s_name)
            STUFF->st_searchpath =
                namelist_append_files(STUFF->st_searchpath, s->s_name);
    }
}